

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O3

Import * __thiscall flatbuffers::python::Imports::Import(Imports *this,string *module,string *name)

{
  pointer pIVar1;
  Import import;
  undefined1 local_60 [32];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_60._8_8_ = 0;
  local_60[0x10] = '\0';
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_60._0_8_ = local_60 + 0x10;
  local_40._M_p = (pointer)&local_30;
  std::__cxx11::string::_M_assign((string *)local_60);
  std::__cxx11::string::_M_assign((string *)&local_40);
  std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::
  emplace_back<flatbuffers::python::Import>(&this->imports,(Import *)local_60);
  pIVar1 = (this->imports).
           super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_p != &local_30) {
    operator_delete(local_40._M_p,
                    CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
    operator_delete((void *)local_60._0_8_,CONCAT71(local_60._17_7_,local_60[0x10]) + 1);
  }
  return pIVar1 + -1;
}

Assistant:

const python::Import &python::Imports::Import(const std::string &module,
                                              const std::string &name) {
  python::Import import;
  import.module = module;
  import.name = name;
  imports.push_back(std::move(import));
  return imports.back();
}